

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  bool bVar15;
  size_type sVar16;
  reference pvVar17;
  long in_RSI;
  int in_EDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000040;
  string command;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000001d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000001f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000320;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000340;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000410;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000450;
  undefined1 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffeb9;
  undefined1 in_stack_fffffffffffffeba;
  undefined1 in_stack_fffffffffffffebb;
  undefined1 in_stack_fffffffffffffebc;
  undefined1 in_stack_fffffffffffffebd;
  undefined1 in_stack_fffffffffffffebe;
  undefined1 in_stack_fffffffffffffebf;
  undefined1 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec1;
  undefined1 in_stack_fffffffffffffec2;
  undefined1 in_stack_fffffffffffffec3;
  undefined1 in_stack_fffffffffffffec4;
  undefined1 in_stack_fffffffffffffec5;
  undefined1 in_stack_fffffffffffffec6;
  undefined1 in_stack_fffffffffffffec7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  allocator_type *in_stack_fffffffffffffee8;
  char **in_stack_fffffffffffffef0;
  char **in_stack_fffffffffffffef8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa0;
  pointer in_stack_ffffffffffffffe0;
  
  this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(in_RSI + (long)in_EDI * 8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1cc9e1);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
             in_stack_fffffffffffffee8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1cca0c);
  sVar16 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&stack0xffffffffffffffd8);
  if (sVar16 < 2) {
    printUsage();
    exit(1);
  }
  pvVar17 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&stack0xffffffffffffffd8,1);
  std::__cxx11::string::string((string *)&stack0xffffffffffffffa0,(string *)pvVar17);
  uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffec7,
                                   CONCAT16(in_stack_fffffffffffffec6,
                                            CONCAT15(in_stack_fffffffffffffec5,
                                                     CONCAT14(in_stack_fffffffffffffec4,
                                                              CONCAT13(in_stack_fffffffffffffec3,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffffec2,
                                                  CONCAT11(in_stack_fffffffffffffec1,
                                                           in_stack_fffffffffffffec0))))))),
                          (char *)CONCAT17(in_stack_fffffffffffffebf,
                                           CONCAT16(in_stack_fffffffffffffebe,
                                                    CONCAT15(in_stack_fffffffffffffebd,
                                                             CONCAT14(in_stack_fffffffffffffebc,
                                                                      CONCAT13(
                                                  in_stack_fffffffffffffebb,
                                                  CONCAT12(in_stack_fffffffffffffeba,
                                                           CONCAT11(in_stack_fffffffffffffeb9,
                                                                    in_stack_fffffffffffffeb8)))))))
                         );
  if ((((bool)uVar1) ||
      (uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffec6,
                                                       CONCAT15(in_stack_fffffffffffffec5,
                                                                CONCAT14(in_stack_fffffffffffffec4,
                                                                         CONCAT13(
                                                  in_stack_fffffffffffffec3,
                                                  CONCAT12(in_stack_fffffffffffffec2,
                                                           CONCAT11(in_stack_fffffffffffffec1,
                                                                    in_stack_fffffffffffffec0)))))))
                               ,(char *)CONCAT17(in_stack_fffffffffffffebf,
                                                 CONCAT16(in_stack_fffffffffffffebe,
                                                          CONCAT15(in_stack_fffffffffffffebd,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffebc,
                                                  CONCAT13(in_stack_fffffffffffffebb,
                                                           CONCAT12(in_stack_fffffffffffffeba,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffeb9,
                                                  in_stack_fffffffffffffeb8)))))))), (bool)uVar2))
     || (uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(in_stack_fffffffffffffec5
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffffec4,
                                                  CONCAT13(in_stack_fffffffffffffec3,
                                                           CONCAT12(in_stack_fffffffffffffec2,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffec1,
                                                  in_stack_fffffffffffffec0))))))),
                                 (char *)CONCAT17(in_stack_fffffffffffffebf,
                                                  CONCAT16(in_stack_fffffffffffffebe,
                                                           CONCAT15(in_stack_fffffffffffffebd,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffebc,
                                                  CONCAT13(in_stack_fffffffffffffebb,
                                                           CONCAT12(in_stack_fffffffffffffeba,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffeb9,
                                                  in_stack_fffffffffffffeb8)))))))), (bool)uVar3)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    train(in_stack_00000410);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this);
  }
  else {
    uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(
                                                  in_stack_fffffffffffffec4,
                                                  CONCAT13(in_stack_fffffffffffffec3,
                                                           CONCAT12(in_stack_fffffffffffffec2,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffec1,
                                                  in_stack_fffffffffffffec0))))))),
                            (char *)CONCAT17(in_stack_fffffffffffffebf,
                                             CONCAT16(in_stack_fffffffffffffebe,
                                                      CONCAT15(in_stack_fffffffffffffebd,
                                                               CONCAT14(in_stack_fffffffffffffebc,
                                                                        CONCAT13(
                                                  in_stack_fffffffffffffebb,
                                                  CONCAT12(in_stack_fffffffffffffeba,
                                                           CONCAT11(in_stack_fffffffffffffeb9,
                                                                    in_stack_fffffffffffffeb8)))))))
                           );
    if (((bool)uVar4) ||
       (uVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,
                                                  CONCAT13(in_stack_fffffffffffffec3,
                                                           CONCAT12(in_stack_fffffffffffffec2,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffec1,
                                                  in_stack_fffffffffffffec0))))))),
                                (char *)CONCAT17(in_stack_fffffffffffffebf,
                                                 CONCAT16(in_stack_fffffffffffffebe,
                                                          CONCAT15(in_stack_fffffffffffffebd,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffebc,
                                                  CONCAT13(in_stack_fffffffffffffebb,
                                                           CONCAT12(in_stack_fffffffffffffeba,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffeb9,
                                                  in_stack_fffffffffffffeb8)))))))), (bool)uVar5)) {
      test(in_stack_00000320);
    }
    else {
      uVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,CONCAT13(
                                                  uVar5,CONCAT12(in_stack_fffffffffffffec2,
                                                                 CONCAT11(in_stack_fffffffffffffec1,
                                                                          in_stack_fffffffffffffec0)
                                                                )))))),
                              (char *)CONCAT17(in_stack_fffffffffffffebf,
                                               CONCAT16(in_stack_fffffffffffffebe,
                                                        CONCAT15(in_stack_fffffffffffffebd,
                                                                 CONCAT14(in_stack_fffffffffffffebc,
                                                                          CONCAT13(
                                                  in_stack_fffffffffffffebb,
                                                  CONCAT12(in_stack_fffffffffffffeba,
                                                           CONCAT11(in_stack_fffffffffffffeb9,
                                                                    in_stack_fffffffffffffeb8)))))))
                             );
      if ((bool)uVar6) {
        quantize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)args.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        uVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,
                                                  CONCAT13(uVar5,CONCAT12(uVar6,CONCAT11(
                                                  in_stack_fffffffffffffec1,
                                                  in_stack_fffffffffffffec0))))))),
                                (char *)CONCAT17(in_stack_fffffffffffffebf,
                                                 CONCAT16(in_stack_fffffffffffffebe,
                                                          CONCAT15(in_stack_fffffffffffffebd,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffebc,
                                                  CONCAT13(in_stack_fffffffffffffebb,
                                                           CONCAT12(in_stack_fffffffffffffeba,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffeb9,
                                                  in_stack_fffffffffffffeb8))))))));
        if ((bool)uVar7) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
          printWordVectors((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_ffffffffffffffe0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(this);
        }
        else {
          uVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,
                                                  CONCAT13(uVar5,CONCAT12(uVar6,CONCAT11(uVar7,
                                                  in_stack_fffffffffffffec0))))))),
                                  (char *)CONCAT17(in_stack_fffffffffffffebf,
                                                   CONCAT16(in_stack_fffffffffffffebe,
                                                            CONCAT15(in_stack_fffffffffffffebd,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffffebc,
                                                  CONCAT13(in_stack_fffffffffffffebb,
                                                           CONCAT12(in_stack_fffffffffffffeba,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffeb9,
                                                  in_stack_fffffffffffffeb8))))))));
          if ((bool)uVar8) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
            printSentenceVectors(in_stack_ffffffffffffffa0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(this);
          }
          else {
            uVar9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,
                                                  CONCAT13(uVar5,CONCAT12(uVar6,CONCAT11(uVar7,uVar8
                                                                                        ))))))),
                                    (char *)CONCAT17(in_stack_fffffffffffffebf,
                                                     CONCAT16(in_stack_fffffffffffffebe,
                                                              CONCAT15(in_stack_fffffffffffffebd,
                                                                       CONCAT14(
                                                  in_stack_fffffffffffffebc,
                                                  CONCAT13(in_stack_fffffffffffffebb,
                                                           CONCAT12(in_stack_fffffffffffffeba,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffeb9,
                                                  in_stack_fffffffffffffeb8))))))));
            if ((bool)uVar9) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
              printNgrams((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_ffffffffffffffe0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(this);
            }
            else {
              uVar10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(
                                                  uVar4,CONCAT13(uVar5,CONCAT12(uVar6,CONCAT11(uVar7
                                                  ,uVar8))))))),
                                       (char *)CONCAT17(uVar9,CONCAT16(in_stack_fffffffffffffebe,
                                                                       CONCAT15(
                                                  in_stack_fffffffffffffebd,
                                                  CONCAT14(in_stack_fffffffffffffebc,
                                                           CONCAT13(in_stack_fffffffffffffebb,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffeba,
                                                  CONCAT11(in_stack_fffffffffffffeb9,
                                                           in_stack_fffffffffffffeb8))))))));
              if ((bool)uVar10) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
                printNgramsEx(in_stack_00000450);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(this);
              }
              else {
                uVar11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(
                                                  uVar4,CONCAT13(uVar5,CONCAT12(uVar6,CONCAT11(uVar7
                                                  ,uVar8))))))),
                                         (char *)CONCAT17(uVar9,CONCAT16(uVar10,CONCAT15(
                                                  in_stack_fffffffffffffebd,
                                                  CONCAT14(in_stack_fffffffffffffebc,
                                                           CONCAT13(in_stack_fffffffffffffebb,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffeba,
                                                  CONCAT11(in_stack_fffffffffffffeb9,
                                                           in_stack_fffffffffffffeb8))))))));
                if ((bool)uVar11) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
                  nn(in_stack_00000340);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(this);
                }
                else {
                  uVar12 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(
                                                  uVar4,CONCAT13(uVar5,CONCAT12(uVar6,CONCAT11(uVar7
                                                  ,uVar8))))))),
                                           (char *)CONCAT17(uVar9,CONCAT16(uVar10,CONCAT15(uVar11,
                                                  CONCAT14(in_stack_fffffffffffffebc,
                                                           CONCAT13(in_stack_fffffffffffffebb,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffeba,
                                                  CONCAT11(in_stack_fffffffffffffeb9,
                                                           in_stack_fffffffffffffeb8))))))));
                  if ((bool)uVar12) {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
                    nnComp(in_stack_000001d0);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(this);
                  }
                  else {
                    uVar13 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,
                                                  CONCAT14(uVar4,CONCAT13(uVar5,CONCAT12(uVar6,
                                                  CONCAT11(uVar7,uVar8))))))),
                                             (char *)CONCAT17(uVar9,CONCAT16(uVar10,CONCAT15(uVar11,
                                                  CONCAT14(uVar12,CONCAT13(in_stack_fffffffffffffebb
                                                                           ,CONCAT12(
                                                  in_stack_fffffffffffffeba,
                                                  CONCAT11(in_stack_fffffffffffffeb9,
                                                           in_stack_fffffffffffffeb8))))))));
                    if ((bool)uVar13) {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::vector(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
                      analogies(in_stack_00000040);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector(this);
                    }
                    else {
                      uVar14 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,
                                                  CONCAT14(uVar4,CONCAT13(uVar5,CONCAT12(uVar6,
                                                  CONCAT11(uVar7,uVar8))))))),
                                               (char *)CONCAT17(uVar9,CONCAT16(uVar10,CONCAT15(
                                                  uVar11,CONCAT14(uVar12,CONCAT13(uVar13,CONCAT12(
                                                  in_stack_fffffffffffffeba,
                                                  CONCAT11(in_stack_fffffffffffffeb9,
                                                           in_stack_fffffffffffffeb8))))))));
                      if (((bool)uVar14) ||
                         (bVar15 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,
                                                  CONCAT14(uVar4,CONCAT13(uVar5,CONCAT12(uVar6,
                                                  CONCAT11(uVar7,uVar8))))))),
                                                  (char *)CONCAT17(uVar9,CONCAT16(uVar10,CONCAT15(
                                                  uVar11,CONCAT14(uVar12,CONCAT13(uVar13,CONCAT12(
                                                  uVar14,CONCAT11(in_stack_fffffffffffffeb9,
                                                                  in_stack_fffffffffffffeb8)))))))),
                         bVar15)) {
                        predict(in_stack_000001f0);
                      }
                      else {
                        bVar15 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,
                                                  CONCAT14(uVar4,CONCAT13(uVar5,CONCAT12(uVar6,
                                                  CONCAT11(uVar7,uVar8))))))),
                                                 (char *)CONCAT17(uVar9,CONCAT16(uVar10,CONCAT15(
                                                  uVar11,CONCAT14(uVar12,CONCAT13(uVar13,CONCAT12(
                                                  uVar14,CONCAT11(bVar15,in_stack_fffffffffffffeb8))
                                                  ))))));
                        if (!bVar15) {
                          printUsage();
                          exit(1);
                        }
                        dump(in_stack_00000180);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  std::vector<std::string> args(argv, argv + argc);
  if (args.size() < 2) {
    printUsage();
    exit(EXIT_FAILURE);
  }
  std::string command(args[1]);
  if (command == "skipgram" || command == "cbow" || command == "supervised") {
    train(args);
  } else if (command == "test" || command == "test-label") {
    test(args);
  } else if (command == "quantize") {
    quantize(args);
  } else if (command == "print-word-vectors") {
    printWordVectors(args);
  } else if (command == "print-sentence-vectors") {
    printSentenceVectors(args);
  } else if (command == "print-ngrams") {
    printNgrams(args);
  } else if (command == "print-ngramsex") {
      printNgramsEx(args);
  } else if (command == "nn") {
    nn(args);
  } else if (command == "nncomp") {
    nnComp(args);
  } else if (command == "analogies") {
    analogies(args);
  } else if (command == "predict" || command == "predict-prob") {
    predict(args);
  } else if (command == "dump") {
    dump(args);
  } else {
    printUsage();
    exit(EXIT_FAILURE);
  }
  return 0;
}